

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O3

void slang::
     function_ref<void(slang::ast::Compilation&,slang::ast::ClassType&,slang::SourceLocation)>::
     callback_fn<slang::ast::builtins::createMailboxClass(slang::ast::Compilation&)::__0>
               (intptr_t callable,Compilation *params,ClassType *params_1,SourceLocation params_2)

{
  Type *type;
  Type *retType;
  Symbol *pSVar1;
  Type *type_00;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  string_view name_05;
  string_view name_06;
  string_view name_07;
  string_view name_08;
  string_view name_09;
  string_view name_10;
  string_view name_11;
  string_view name_12;
  string_view name_13;
  string_view name_14;
  ClassBuilder builder;
  MethodBuilder ctor;
  MethodBuilder try_peek;
  MethodBuilder peek;
  MethodBuilder try_get;
  MethodBuilder get;
  MethodBuilder try_put;
  MethodBuilder put;
  ClassBuilder local_380;
  _Storage<slang::SVInt,_false> local_370;
  char local_360;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_358;
  uint local_350;
  ushort local_34c;
  _Storage<slang::SVInt,_false> local_348;
  char local_338;
  _Storage<slang::SVInt,_false> local_330;
  char local_320;
  _Storage<slang::SVInt,_false> local_318;
  char local_308;
  _Storage<slang::SVInt,_false> local_300;
  char local_2f0;
  _Storage<slang::SVInt,_false> local_2e8;
  char local_2d8;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_2d0;
  uint local_2c8;
  ushort local_2c4;
  _Storage<slang::SVInt,_false> local_2c0;
  char local_2b0;
  MethodBuilder local_2a8;
  MethodBuilder local_258;
  MethodBuilder local_208;
  MethodBuilder local_1b8;
  MethodBuilder local_168;
  MethodBuilder local_118;
  MethodBuilder local_c8;
  MethodBuilder local_78;
  
  name_07._M_str = "T";
  name_07._M_len = 1;
  pSVar1 = ast::Scope::find(&params_1->super_Scope,name_07);
  type_00 = ast::DeclaredType::getType((DeclaredType *)&pSVar1[1].location);
  ast::ClassBuilder::ClassBuilder(&local_380,params,params_1);
  type = params->intType;
  retType = params->voidType;
  local_350 = 0x20;
  local_34c = 1;
  local_358.val = 0;
  SVInt::clearUnusedBits((SVInt *)&local_358);
  local_2c8 = 0x20;
  local_2c4 = 1;
  local_2d0.val = 1;
  SVInt::clearUnusedBits((SVInt *)&local_2d0);
  name._M_str = "new";
  name._M_len = 3;
  ast::ClassBuilder::addMethod(&local_2a8,&local_380,name,retType,Function);
  ast::MethodBuilder::addFlags(&local_2a8,(bitmask<slang::ast::MethodFlags>)0x8);
  SVInt::SVInt(&local_370._M_value,(SVIntStorage *)&local_358);
  local_360 = '\x01';
  name_08._M_str = "bound";
  name_08._M_len = 5;
  ast::MethodBuilder::addArg
            (&local_2a8,name_08,type,In,(optional<slang::SVInt> *)&local_370._M_value);
  if ((local_360 == '\x01') &&
     (((local_360 = '\0', 0x40 < local_370._M_value.super_SVIntStorage.bitWidth ||
       ((local_370._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
      (local_370._M_value.super_SVIntStorage.field_0.val != 0)))) {
    operator_delete__((void *)local_370._M_value.super_SVIntStorage.field_0);
  }
  name_00._M_str = "num";
  name_00._M_len = 3;
  ast::ClassBuilder::addMethod(&local_78,&local_380,name_00,type,Function);
  ast::MethodBuilder::~MethodBuilder(&local_78);
  name_01._M_str = "put";
  name_01._M_len = 3;
  ast::ClassBuilder::addMethod(&local_c8,&local_380,name_01,retType,Task);
  local_2d8 = '\0';
  name_09._M_str = "message";
  name_09._M_len = 7;
  ast::MethodBuilder::addArg
            (&local_c8,name_09,type_00,In,(optional<slang::SVInt> *)&local_2e8._M_value);
  if (((local_2d8 == '\x01') &&
      ((local_2d8 = '\0', 0x40 < local_2e8._M_value.super_SVIntStorage.bitWidth ||
       ((local_2e8._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_2e8._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_2e8._M_value.super_SVIntStorage.field_0);
  }
  name_02._M_str = "try_put";
  name_02._M_len = 7;
  ast::ClassBuilder::addMethod(&local_118,&local_380,name_02,type,Function);
  local_2f0 = '\0';
  name_10._M_str = "message";
  name_10._M_len = 7;
  ast::MethodBuilder::addArg
            (&local_118,name_10,type_00,In,(optional<slang::SVInt> *)&local_300._M_value);
  if (((local_2f0 == '\x01') &&
      ((local_2f0 = '\0', 0x40 < local_300._M_value.super_SVIntStorage.bitWidth ||
       ((local_300._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_300._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_300._M_value.super_SVIntStorage.field_0);
  }
  name_03._M_str = "get";
  name_03._M_len = 3;
  ast::ClassBuilder::addMethod(&local_168,&local_380,name_03,retType,Task);
  local_308 = '\0';
  name_11._M_str = "message";
  name_11._M_len = 7;
  ast::MethodBuilder::addArg
            (&local_168,name_11,type_00,Ref,(optional<slang::SVInt> *)&local_318._M_value);
  if ((local_308 == '\x01') &&
     (((local_308 = '\0', 0x40 < local_318._M_value.super_SVIntStorage.bitWidth ||
       ((local_318._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
      (local_318._M_value.super_SVIntStorage.field_0.val != 0)))) {
    operator_delete__((void *)local_318._M_value.super_SVIntStorage.field_0);
  }
  name_04._M_str = "try_get";
  name_04._M_len = 7;
  ast::ClassBuilder::addMethod(&local_1b8,&local_380,name_04,type,Function);
  local_320 = '\0';
  name_12._M_str = "message";
  name_12._M_len = 7;
  ast::MethodBuilder::addArg
            (&local_1b8,name_12,type_00,Ref,(optional<slang::SVInt> *)&local_330._M_value);
  if (((local_320 == '\x01') &&
      ((local_320 = '\0', 0x40 < local_330._M_value.super_SVIntStorage.bitWidth ||
       ((local_330._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_330._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_330._M_value.super_SVIntStorage.field_0);
  }
  name_05._M_str = "peek";
  name_05._M_len = 4;
  ast::ClassBuilder::addMethod(&local_208,&local_380,name_05,retType,Task);
  local_338 = '\0';
  name_13._M_str = "message";
  name_13._M_len = 7;
  ast::MethodBuilder::addArg
            (&local_208,name_13,type_00,Ref,(optional<slang::SVInt> *)&local_348._M_value);
  if (((local_338 == '\x01') &&
      ((local_338 = '\0', 0x40 < local_348._M_value.super_SVIntStorage.bitWidth ||
       ((local_348._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)))) &&
     (local_348._M_value.super_SVIntStorage.field_0.val != 0)) {
    operator_delete__((void *)local_348._M_value.super_SVIntStorage.field_0);
  }
  name_06._M_str = "try_peek";
  name_06._M_len = 8;
  ast::ClassBuilder::addMethod(&local_258,&local_380,name_06,type,Function);
  local_2b0 = '\0';
  name_14._M_str = "message";
  name_14._M_len = 7;
  ast::MethodBuilder::addArg
            (&local_258,name_14,type_00,Ref,(optional<slang::SVInt> *)&local_2c0._M_value);
  if ((local_2b0 == '\x01') &&
     (((local_2b0 = '\0', 0x40 < local_2c0._M_value.super_SVIntStorage.bitWidth ||
       ((local_2c0._M_value.super_SVIntStorage.unknownFlag & 1U) != 0)) &&
      (local_2c0._M_value.super_SVIntStorage.field_0.val != 0)))) {
    operator_delete__((void *)local_2c0._M_value.super_SVIntStorage.field_0);
  }
  ast::MethodBuilder::~MethodBuilder(&local_258);
  ast::MethodBuilder::~MethodBuilder(&local_208);
  ast::MethodBuilder::~MethodBuilder(&local_1b8);
  ast::MethodBuilder::~MethodBuilder(&local_168);
  ast::MethodBuilder::~MethodBuilder(&local_118);
  ast::MethodBuilder::~MethodBuilder(&local_c8);
  ast::MethodBuilder::~MethodBuilder(&local_2a8);
  if (((0x40 < local_2c8) || ((local_2c4 & 0x100) != 0)) && ((void *)local_2d0.val != (void *)0x0))
  {
    operator_delete__(local_2d0.pVal);
  }
  if (((0x40 < local_350) || ((local_34c & 0x100) != 0)) && ((void *)local_358.val != (void *)0x0))
  {
    operator_delete__(local_358.pVal);
  }
  return;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }